

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::anon_unknown_0::ComputeShaderBase::ValidateReadBuffer
          (ComputeShaderBase *this,int x,int y,int w,int h,vec4 *expected)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  bool bVar5;
  reference pvVar6;
  float *pfVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  int local_64;
  int local_60;
  int i;
  int j;
  allocator<tcu::Vector<float,_4>_> local_49;
  undefined1 local_48 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> display;
  vec4 *expected_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  ComputeShaderBase *this_local;
  
  display.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = expected;
  std::allocator<tcu::Vector<float,_4>_>::allocator(&local_49);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_48,
             (long)(w * h),&local_49);
  std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_49);
  pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_48,0);
  glu::CallLogWrapper::glReadPixels
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,x,y,w,h,0x1908,0x1406,
             pvVar6);
  local_60 = 0;
  do {
    if (h <= local_60) {
      this_local._7_1_ = true;
LAB_00f75ac7:
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_48)
      ;
      return this_local._7_1_;
    }
    for (local_64 = 0; local_64 < w; local_64 = local_64 + 1) {
      pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          local_48,(long)(local_60 * w + local_64));
      bVar5 = ColorEqual(this,pvVar6,
                         display.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->g_color_eps);
      if (!bVar5) {
        pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)local_48,(long)(local_60 * w + local_64));
        pfVar7 = tcu::Vector<float,_4>::x(pvVar6);
        fVar1 = *pfVar7;
        pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)local_48,(long)(local_60 * w + local_64));
        pfVar7 = tcu::Vector<float,_4>::y(pvVar6);
        fVar2 = *pfVar7;
        pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)local_48,(long)(local_60 * w + local_64));
        pfVar7 = tcu::Vector<float,_4>::z(pvVar6);
        fVar3 = *pfVar7;
        pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)local_48,(long)(local_60 * w + local_64));
        pfVar7 = tcu::Vector<float,_4>::w(pvVar6);
        fVar4 = *pfVar7;
        fVar8 = tcu::Vector<float,_4>::x
                          (display.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        fVar9 = tcu::Vector<float,_4>::y
                          (display.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        fVar10 = tcu::Vector<float,_4>::z
                           (display.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        fVar11 = tcu::Vector<float,_4>::w
                           (display.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        anon_unknown_0::Output
                  ("Color at (%d, %d) is [%f, %f, %f, %f] should be [%f, %f, %f, %f].\n",
                   (double)fVar1,(double)fVar2,(double)fVar3,(double)fVar4,(double)fVar8,
                   (double)fVar9,(double)fVar10,(double)fVar11,(ulong)(uint)(x + local_64),
                   (ulong)(uint)(y + local_60));
        this_local._7_1_ = false;
        goto LAB_00f75ac7;
      }
    }
    local_60 = local_60 + 1;
  } while( true );
}

Assistant:

bool ValidateReadBuffer(int x, int y, int w, int h, const vec4& expected)
	{
		std::vector<vec4> display(w * h);
		glReadPixels(x, y, w, h, GL_RGBA, GL_FLOAT, &display[0]);

		for (int j = 0; j < h; ++j)
		{
			for (int i = 0; i < w; ++i)
			{
				if (!ColorEqual(display[j * w + i], expected, g_color_eps))
				{
					Output("Color at (%d, %d) is [%f, %f, %f, %f] should be [%f, %f, %f, %f].\n", x + i, y + j,
						   display[j * w + i].x(), display[j * w + i].y(), display[j * w + i].z(),
						   display[j * w + i].w(), expected.x(), expected.y(), expected.z(), expected.w());
					return false;
				}
			}
		}

		return true;
	}